

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cc
# Opt level: O2

double __thiscall
calculator::ExpressionTree::calcValue(ExpressionTree *this,node *x,node *y,Tag tag)

{
  mapped_type *this_00;
  long lVar1;
  SyntaxError *this_01;
  DivZeroException *this_02;
  ShiftNegativeException *this_03;
  ulong uVar2;
  pointer_____offset_0x10___ *ppuVar3;
  double dVar4;
  allocator<char> local_49;
  double local_48;
  key_type local_40;
  
  if ((x == (node *)0x0) || (y == (node *)0x0)) {
    this_01 = (SyntaxError *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"need two operator numbers",&local_49);
    SyntaxError::SyntaxError(this_01,&local_40);
    __cxa_throw(this_01,&SyntaxError::typeinfo,SyntaxError::~SyntaxError);
  }
  local_48 = 0.0;
  switch(tag) {
  case And:
    uVar2 = (long)y->value & (long)x->value;
    goto LAB_00108b2b;
  case Or:
    uVar2 = (long)y->value | (long)x->value;
    goto LAB_00108b2b;
  case Xor:
    uVar2 = (long)y->value ^ (long)x->value;
LAB_00108b2b:
    local_48 = (double)(long)uVar2;
    break;
  case Add:
    local_48 = x->value + y->value;
    break;
  case Sub:
    local_48 = x->value - y->value;
    break;
  case Mul:
    local_48 = x->value * y->value;
    break;
  case Div:
    local_48 = y->value;
    if (((y->type == Number) && (local_48 == 0.0)) && (!NAN(local_48))) {
      this_02 = (DivZeroException *)__cxa_allocate_exception(0x28);
      DivZeroException::DivZeroException(this_02,x->value,(int)y->value);
      __cxa_throw(this_02,&DivZeroException::typeinfo,SyntaxError::~SyntaxError);
    }
    local_48 = x->value / local_48;
    break;
  case Mod:
    dVar4 = fmod(x->value,y->value);
    return dVar4;
  case ShiftLeft:
    if ((x->type == Float) || (y->type == Float)) {
      this_03 = (ShiftNegativeException *)__cxa_allocate_exception(0x28);
      ShiftLeftRightException::ShiftLeftRightException((ShiftLeftRightException *)this_03);
LAB_00108c66:
      ppuVar3 = &ShiftLeftRightException::typeinfo;
LAB_00108cd2:
      __cxa_throw(this_03,ppuVar3,SyntaxError::~SyntaxError);
    }
    if (y->value < 0.0) {
      this_03 = (ShiftNegativeException *)__cxa_allocate_exception(0x28);
      ShiftNegativeException::ShiftNegativeException(this_03);
LAB_00108ccb:
      ppuVar3 = &ShiftNegativeException::typeinfo;
      goto LAB_00108cd2;
    }
    lVar1 = (long)x->value << ((byte)(long)y->value & 0x3f);
    goto LAB_00108be5;
  case ShiftRight:
    if ((x->type == Float) || (y->type == Float)) {
      this_03 = (ShiftNegativeException *)__cxa_allocate_exception(0x28);
      ShiftLeftRightException::ShiftLeftRightException((ShiftLeftRightException *)this_03);
      goto LAB_00108c66;
    }
    if (y->value < 0.0) {
      this_03 = (ShiftNegativeException *)__cxa_allocate_exception(0x28);
      ShiftNegativeException::ShiftNegativeException(this_03);
      goto LAB_00108ccb;
    }
    lVar1 = (long)x->value >> ((byte)(long)y->value & 0x3f);
LAB_00108be5:
    local_48 = (double)lVar1;
    break;
  case Pow:
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"pow",&local_49);
    this_00 = std::__detail::
              _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<double_(double,_double)>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<double_(double,_double)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<double_(double,_double)>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<double_(double,_double)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)&(this->lexer_).binary_functions,&local_40);
    local_48 = std::function<double_(double,_double)>::operator()(this_00,x->value,y->value);
    std::__cxx11::string::~string((string *)&local_40);
  }
  return local_48;
}

Assistant:

double ExpressionTree::calcValue(node *x, node *y, Tag tag) {
    if (y == nullptr || x == nullptr)
        throw SyntaxError("need two operator numbers");
    switch (tag) {
        case Tag::Add:
            return x->value + y->value;
        case Tag::Sub:
            return x->value - y->value;
        case Tag::Mul:
            return x->value * y->value;
        case Tag::Div:
            if (y->type == Tag::Number && y->value == 0) {
                throw DivZeroException(x->value, y->value);
            }
            return x->value / y->value;
        case Tag::Mod:
            return fmod(x->value, y->value);
        case Tag::And:
            return (Integer)x->value & (Integer)y->value;
        case Tag::Or:
            return (Integer)x->value | (Integer)y->value;
        case Tag::Xor:
            return (Integer)x->value ^ (Integer)y->value;
        case Tag::ShiftLeft:
            // 左移或右移的操作数不能是浮点数
            if (x->type == Tag::Float || y->type == Tag::Float)
                throw ShiftLeftRightException();
            // 左移或右移的右操作数不能是负数
            if (y->value < 0) throw ShiftNegativeException();
            return (Integer)x->value << (Integer)y->value;
        case Tag::ShiftRight:
            if (x->type == Tag::Float || y->type == Tag::Float)
                throw ShiftLeftRightException();
            if (y->value < 0) throw ShiftNegativeException();
            return (Integer)x->value >> (Integer)y->value;
        case Tag::Pow:
            return lexer_.binary_functions["pow"](x->value, y->value);
        default:
            break;
    }
    return 0;
}